

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status
fdb_open_custom_cmp(fdb_file_handle **ptr_fhandle,char *filename,fdb_config *fconfig,
                   size_t num_functions,char **kvs_names,fdb_custom_cmp_variable *functions,
                   void **user_params)

{
  bool bVar1;
  fdb_status fVar2;
  fdb_file_handle *fhandle;
  fdb_kvs_handle *root;
  undefined8 local_140;
  fdb_custom_cmp_variable p_Stack_138;
  void *local_130;
  fdb_config local_128;
  
  if (fconfig == (fdb_config *)0x0) {
    get_default_config();
  }
  else {
    bVar1 = validate_fdb_config(fconfig);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    memcpy(&local_128,fconfig,0xf8);
  }
  if (local_128.multi_kv_instances == false) {
    fVar2 = FDB_RESULT_INVALID_CONFIG;
  }
  else {
    fhandle = (fdb_file_handle *)calloc(1,0x28);
    fVar2 = FDB_RESULT_ALLOC_FAIL;
    if (fhandle != (fdb_file_handle *)0x0) {
      root = (fdb_kvs_handle *)calloc(1,0x208);
      if (root == (fdb_kvs_handle *)0x0) {
        free(fhandle);
      }
      else {
        pthread_spin_lock(&initial_lock);
        fdb_open_inprog = fdb_open_inprog + 1;
        pthread_spin_unlock(&initial_lock);
        LOCK();
        (root->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        UNLOCK();
        root->shandle = (snap_handle *)0x0;
        get_default_kvs_config();
        (root->kvs_config).custom_cmp_param = local_130;
        *(undefined8 *)&root->kvs_config = local_140;
        (root->kvs_config).custom_cmp = p_Stack_138;
        fVar2 = fdb_init(fconfig);
        if (fVar2 == FDB_RESULT_SUCCESS) {
          fdb_file_handle_init(fhandle,root);
          fdb_file_handle_parse_cmp_func(fhandle,num_functions,kvs_names,functions,user_params);
          fVar2 = _fdb_open(root,filename,FDB_VFILENAME,&local_128);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            *ptr_fhandle = fhandle;
            filemgr_fhandle_add(root->file,fhandle);
          }
          else {
            *ptr_fhandle = (fdb_file_handle *)0x0;
            free(root);
            fdb_file_handle_free(fhandle);
          }
        }
        else {
          free(root);
          free(fhandle);
        }
        pthread_spin_lock(&initial_lock);
        fdb_open_inprog = fdb_open_inprog - 1;
        pthread_spin_unlock(&initial_lock);
      }
    }
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_open_custom_cmp(fdb_file_handle **ptr_fhandle,
                               const char *filename,
                               fdb_config *fconfig,
                               size_t num_functions,
                               char **kvs_names,
                               fdb_custom_cmp_variable *functions,
                               void **user_params)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_file_handle *fhandle;
    fdb_kvs_handle *handle;

    if (fconfig) {
        if (validate_fdb_config(fconfig)) {
            config = *fconfig;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config = get_default_config();
    }

    if (config.multi_kv_instances == false) {
        // single KV instance mode does not support customized cmp function
        return FDB_RESULT_INVALID_CONFIG;
    }

    fhandle = (fdb_file_handle*)calloc(1, sizeof(fdb_file_handle));
    if (!fhandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        free(fhandle);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

#ifndef SPIN_INITIALIZER
    init_initial_lock_status();
#endif

    spin_lock(&initial_lock);
    fdb_open_inprog++;
    spin_unlock(&initial_lock);

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->shandle = NULL;
    handle->kvs_config = get_default_kvs_config();

    fdb_status fs = fdb_init(fconfig);
    if (fs != FDB_RESULT_SUCCESS) {
        free(handle);
        free(fhandle);
        spin_lock(&initial_lock);
        fdb_open_inprog--;
        spin_unlock(&initial_lock);
        return fs;
    }
    fdb_file_handle_init(fhandle, handle);

    // insert kvs_names and functions into fhandle's list
    fdb_file_handle_parse_cmp_func(fhandle,
                                   num_functions,
                                   kvs_names,
                                   functions,
                                   user_params);

    fs = _fdb_open(handle, filename, FDB_VFILENAME, &config);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_fhandle = fhandle;
        filemgr_fhandle_add(handle->file, fhandle);
    } else {
        *ptr_fhandle = NULL;
        free(handle);
        fdb_file_handle_free(fhandle);
    }
    spin_lock(&initial_lock);
    fdb_open_inprog--;
    spin_unlock(&initial_lock);
    return fs;
}